

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O1

void nv40_start_monitoring(int cnum,int set,int s1,int s2,int s3,int s4)

{
  void *pvVar1;
  
  pvVar1 = nva_cards[cnum].bar0;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa7c0)) = 1;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa500)) = 0;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa520)) = 0;
  *(int *)((long)pvVar1 + (ulong)(set * 4 + 0xa400)) = s1;
  *(int *)((long)pvVar1 + (ulong)(set * 4 + 0xa440)) = s2;
  *(int *)((long)pvVar1 + (ulong)(set * 4 + 0xa480)) = s3;
  *(int *)((long)pvVar1 + (ulong)(set * 4 + 0xa4c0)) = s4;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa420)) = 0xaaaa;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa460)) = 0xaaaa;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa4a0)) = 0xaaaa;
  *(undefined4 *)((long)pvVar1 + (ulong)(set * 4 + 0xa4e0)) = 0xaaaa;
  *(uint *)((long)pvVar1 + 0x400084) = *(uint *)((long)pvVar1 + 0x400084) | 0x20;
  return;
}

Assistant:

void nv40_start_monitoring(int cnum, int set, int s1, int s2, int s3, int s4)
{
	nva_wr32(cnum, 0xa7c0 + set * 4, 0x1);
	nva_wr32(cnum, 0xa500 + set * 4, 0);
	nva_wr32(cnum, 0xa520 + set * 4, 0);

	nva_wr32(cnum, 0xa400 + set * 4, s1);
	nva_wr32(cnum, 0xa440 + set * 4, s2);
	nva_wr32(cnum, 0xa480 + set * 4, s3);
	nva_wr32(cnum, 0xa4c0 + set * 4, s4);

	nva_wr32(cnum, 0xa420 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa460 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa4a0 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa4e0 + set * 4, 0xaaaa);

	/* reset the counters */
	nva_mask(cnum, 0x400084, 0x20, 0x20);
}